

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitUseBeforeDeclaration(Symbol *sym,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  Scope *pSVar1;
  
  if ((sym != (Symbol *)0x0) && ((*(ushort *)&sym->field_0x42 & 0x4001) == 1)) {
    pSVar1 = byteCodeGenerator->currentScope;
    while (pSVar1 != sym->scope) {
      if ((pSVar1->field_0x44 & 1) != 0) {
        return;
      }
      pSVar1 = pSVar1->enclosingScope;
      if (pSVar1 == (Scope *)0x0) {
        return;
      }
    }
    if (sym->scope->func == funcInfo) {
      Js::ByteCodeWriter::W1(&byteCodeGenerator->m_writer,RuntimeReferenceError,0x13f9);
      return;
    }
  }
  return;
}

Assistant:

void EmitUseBeforeDeclaration(Symbol *sym, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    // Don't emit static use-before-declaration error in a closure or dynamic scope case. We detect such cases with dynamic checks,
    // if necessary.
    if (sym != nullptr &&
        !sym->GetIsModuleExportStorage() &&
        sym->GetNeedDeclaration() &&
        byteCodeGenerator->GetCurrentScope()->HasStaticPathToAncestor(sym->GetScope()) &&
        sym->GetScope()->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(byteCodeGenerator, Js::Constants::NoRegister);
    }
}